

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceBindingBase.hpp
# Opt level: O3

void __thiscall
Diligent::ShaderResourceBindingBase<Diligent::EngineVkImplTraits>::ShaderResourceBindingBase
          (ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *this,
          IReferenceCounters *pRefCounters,ResourceSignatureType *pPRS)

{
  ShaderResourceCacheImplType *ResourceCache;
  PIPELINE_TYPE PipelineType;
  char cVar1;
  PipelineResourceSignatureVkImpl *pPVar2;
  size_t size;
  SHADER_TYPE ShaderType;
  Int32 IVar3;
  SHADER_TYPE SVar4;
  ShaderVariableManagerImplType *pSVar5;
  IMemoryAllocator *Allocator;
  array<signed_char,_6UL> *Args_1;
  uint uVar6;
  PipelineResourceSignatureType **ppPVar7;
  Uint32 UVar8;
  string msg;
  FixedLinearAllocator MemPool;
  string local_c0;
  array<signed_char,_6UL> *local_a0;
  ShaderResourceCacheImplType *local_98;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *local_90;
  FixedLinearAllocator local_88;
  
  RefCountedObject<Diligent::IShaderResourceBindingVk>::RefCountedObject<>
            ((RefCountedObject<Diligent::IShaderResourceBindingVk> *)this,pRefCounters);
  (this->super_ObjectBase<Diligent::IShaderResourceBindingVk>).
  super_RefCountedObject<Diligent::IShaderResourceBindingVk>.super_IShaderResourceBindingVk.
  super_IShaderResourceBinding.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_00920780;
  local_90 = &this->m_pPRS;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::RefCntAutoPtr(local_90,pPRS);
  local_a0 = &this->m_ActiveShaderStageIndex;
  ResourceCache = &this->m_ShaderResourceCache;
  (this->m_ShaderResourceCache).super_ShaderResourceCacheBase.m_DvpRevision.
  super___atomic_base<unsigned_int>._M_i = 0;
  (this->m_ShaderResourceCache).m_pMemory._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl
       = (STDDeleter<void,_Diligent::IMemoryAllocator>)0x0;
  (this->m_ShaderResourceCache).m_pMemory._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  (this->m_ShaderResourceCache).m_NumSets = 0;
  (this->m_ShaderResourceCache).m_NumDynamicBuffers = 0;
  *(undefined4 *)&(this->m_ShaderResourceCache).field_0x1c = 0x80000000;
  (this->m_ShaderResourceCache).m_DbgInitializedResources.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ShaderResourceCache).m_DbgInitializedResources.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ShaderResourceCache).m_DbgInitializedResources.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_pShaderVarMgrs = (ShaderVariableManagerImplType *)0x0;
  this->m_bStaticResourcesInitialized = false;
  (this->m_ActiveShaderStageIndex)._M_elems[0] = -1;
  (this->m_ActiveShaderStageIndex)._M_elems[1] = -1;
  (this->m_ActiveShaderStageIndex)._M_elems[2] = -1;
  (this->m_ActiveShaderStageIndex)._M_elems[3] = -1;
  (this->m_ActiveShaderStageIndex)._M_elems[4] = -1;
  (this->m_ActiveShaderStageIndex)._M_elems[5] = -1;
  pPVar2 = (this->m_pPRS).m_pObject;
  SVar4 = (pPVar2->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).m_ShaderStages
  ;
  uVar6 = SVar4 - (SVar4 >> 1 & 0x55555555);
  uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
  uVar6 = ((uVar6 >> 4) + uVar6 & 0xf0f0f0f) * 0x1010101 >> 0x18;
  Args_1 = (array<signed_char,_6UL> *)(ulong)uVar6;
  local_98 = ResourceCache;
  if (SVar4 != SHADER_TYPE_UNKNOWN) {
    UVar8 = 0;
    PipelineType = (pPVar2->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                   m_PipelineType;
    do {
      ShaderType = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::
                   GetActiveShaderStageType
                             (&pPRS->
                               super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                              UVar8);
      IVar3 = GetShaderTypePipelineIndex(ShaderType,PipelineType);
      local_a0->_M_elems[IVar3] = (char)UVar8;
      UVar8 = UVar8 + 1;
      Args_1 = local_a0;
    } while (uVar6 + (uVar6 == 0) != UVar8);
  }
  local_88.m_pAllocator = GetRawAllocator();
  local_88.m_ReservedSize = 0;
  local_88.m_CurrAlignment = 0;
  local_88.m_pDataStart = (uint8_t *)0x0;
  local_88.m_pCurrPtr = (uint8_t *)0x0;
  local_88.m_DbgCurrAllocation = 0;
  local_88.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.m_DbgUsingExternalMemory = false;
  size = (ulong)(uVar6 << 4) * 3;
  FixedLinearAllocator::AddSpace(&local_88,size,8);
  FixedLinearAllocator::Reserve(&local_88);
  pSVar5 = (ShaderVariableManagerImplType *)FixedLinearAllocator::Allocate(&local_88,size,8);
  if (SVar4 != SHADER_TYPE_UNKNOWN) {
    Args_1 = (array<signed_char,_6UL> *)(ulong)uVar6;
    ppPVar7 = &(pSVar5->
               super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
               ).m_pSignature;
    do {
      ((ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl> *)
      (ppPVar7 + -2))->m_Owner = (IObject *)this;
      ppPVar7[-1] = (PipelineResourceSignatureType *)ResourceCache;
      *ppPVar7 = (PipelineResourceSignatureType *)0x0;
      ppPVar7[1] = (PipelineResourceSignatureType *)0x0;
      *(undefined8 *)((long)ppPVar7 + 0xc) = 0;
      *(undefined8 *)((long)ppPVar7 + 0x14) = 0;
      ppPVar7 = ppPVar7 + 6;
      Args_1 = (array<signed_char,_6UL> *)((long)Args_1 - 1);
    } while (Args_1 != (array<signed_char,_6UL> *)0x0);
  }
  this->m_pShaderVarMgrs = pSVar5;
  local_88.m_pAllocator = (IMemoryAllocator *)0x0;
  if ((ShaderVariableManagerImplType *)local_88.m_pDataStart != pSVar5) {
    FormatString<char[26],char[24]>
              (&local_c0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Ptr == m_pShaderVarMgrs",Args_1->_M_elems);
    DebugAssertionFailed
              ((Char *)CONCAT62(local_c0._M_dataplus._M_p._2_6_,local_c0._M_dataplus._M_p._0_2_),
               "ShaderResourceBindingBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceBindingBase.hpp"
               ,0x67);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT62(local_c0._M_dataplus._M_p._2_6_,local_c0._M_dataplus._M_p._0_2_) !=
        &local_c0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT62(local_c0._M_dataplus._M_p._2_6_,local_c0._M_dataplus._M_p._0_2_),
                      local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  PipelineResourceSignatureVkImpl::InitSRBResourceCache(pPRS,ResourceCache);
  if (SVar4 != SHADER_TYPE_UNKNOWN) {
    UVar8 = 0;
    do {
      SVar4 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetActiveShaderStageType
                        (&pPRS->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                         UVar8);
      IVar3 = GetShaderTypePipelineIndex
                        (SVar4,(pPRS->
                               super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                               m_PipelineType);
      cVar1 = local_a0->_M_elems[IVar3];
      if ((cVar1 < '\0') || (uVar6 <= (uint)(int)cVar1)) {
        FormatString<char[26],char[53]>
                  (&local_c0,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"MgrInd >= 0 && MgrInd < static_cast<int>(NumShaders)",
                   local_a0->_M_elems);
        DebugAssertionFailed
                  ((Char *)CONCAT62(local_c0._M_dataplus._M_p._2_6_,local_c0._M_dataplus._M_p._0_2_)
                   ,"ShaderResourceBindingBase",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceBindingBase.hpp"
                   ,0x75);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT62(local_c0._M_dataplus._M_p._2_6_,local_c0._M_dataplus._M_p._0_2_) !=
            &local_c0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT62(local_c0._M_dataplus._M_p._2_6_,local_c0._M_dataplus._M_p._0_2_),
                          local_c0.field_2._M_allocated_capacity + 1);
        }
      }
      Allocator = SRBMemoryAllocator::GetShaderVariableDataAllocator
                            (&(pPRS->
                              super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                              m_SRBMemAllocator,UVar8);
      local_c0._M_dataplus._M_p._0_2_ = 0x201;
      ShaderVariableManagerVk::Initialize
                (this->m_pShaderVarMgrs + (int)cVar1,pPRS,Allocator,
                 (SHADER_RESOURCE_VARIABLE_TYPE *)&local_c0,2,SVar4);
      UVar8 = UVar8 + 1;
    } while (uVar6 + (uVar6 == 0) != UVar8);
  }
  FixedLinearAllocator::~FixedLinearAllocator(&local_88);
  return;
}

Assistant:

ShaderResourceBindingBase(IReferenceCounters* pRefCounters, ResourceSignatureType* pPRS) :
        TObjectBase{pRefCounters},
        m_pPRS{pPRS},
        m_ShaderResourceCache{ResourceCacheContentType::SRB}
    {
        try
        {
            m_ActiveShaderStageIndex.fill(-1);

            const Uint32        NumShaders   = GetNumShaders();
            const PIPELINE_TYPE PipelineType = GetPipelineType();
            for (Uint32 s = 0; s < NumShaders; ++s)
            {
                const SHADER_TYPE ShaderType = pPRS->GetActiveShaderStageType(s);
                const Int32       ShaderInd  = GetShaderTypePipelineIndex(ShaderType, PipelineType);

                m_ActiveShaderStageIndex[ShaderInd] = static_cast<Int8>(s);
            }


            FixedLinearAllocator MemPool{GetRawAllocator()};
            MemPool.AddSpace<ShaderVariableManagerImplType>(NumShaders);
            MemPool.Reserve();
            static_assert(std::is_nothrow_constructible<ShaderVariableManagerImplType, decltype(*this), ShaderResourceCacheImplType&>::value,
                          "Constructor of ShaderVariableManagerImplType must be noexcept, so we can safely construct all managers");
            m_pShaderVarMgrs = MemPool.ConstructArray<ShaderVariableManagerImplType>(NumShaders, std::ref(*this), std::ref(m_ShaderResourceCache));

            // The memory is now owned by ShaderResourceBindingBase and will be freed by Destruct().
            void* Ptr = MemPool.ReleaseOwnership();
            VERIFY_EXPR(Ptr == m_pShaderVarMgrs);
            (void)Ptr;

            // It is important to construct all objects before initializing them because if an exception is thrown,
            // Destruct() will call destructors for all non-null objects.

            pPRS->InitSRBResourceCache(m_ShaderResourceCache);

            SRBMemoryAllocator& SRBMemAllocator = pPRS->GetSRBMemoryAllocator();
            for (Uint32 s = 0; s < NumShaders; ++s)
            {
                const SHADER_TYPE ShaderType = pPRS->GetActiveShaderStageType(s);
                const Int32       ShaderInd  = GetShaderTypePipelineIndex(ShaderType, pPRS->GetPipelineType());
                const int         MgrInd     = m_ActiveShaderStageIndex[ShaderInd];
                VERIFY_EXPR(MgrInd >= 0 && MgrInd < static_cast<int>(NumShaders));

                IMemoryAllocator& VarDataAllocator = SRBMemAllocator.GetShaderVariableDataAllocator(s);

                // Initialize vars manager to reference mutable and dynamic variables
                // Note that the cache has space for all variable types
                const SHADER_RESOURCE_VARIABLE_TYPE VarTypes[] = {SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE, SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC};
                m_pShaderVarMgrs[MgrInd].Initialize(*pPRS, VarDataAllocator, VarTypes, _countof(VarTypes), ShaderType);
            }
        }
        catch (...)
        {
            // We must release objects manually as destructor will not be called.
            Destruct();
            throw;
        }
    }